

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O3

bool __thiscall NJamSpell::TSpellCorrector::LoadCache(TSpellCorrector *this,string *cacheFile)

{
  uint64_t uVar1;
  char cVar2;
  uint64_t uVar3;
  TBloomFilter *this_00;
  TBloomFilter *this_01;
  bool bVar4;
  istream local_258 [8];
  ifstream in;
  uint64_t local_50;
  uint64_t checkSum;
  TBloomFilter *local_40;
  long local_38;
  uint64_t magicByte;
  uint16_t version;
  
  std::ifstream::ifstream(local_258,(string *)cacheFile,_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    magicByte._6_2_ = 0;
    local_38 = 0;
    std::istream::read((char *)local_258,(long)&local_38);
    if (local_38 == 0x34e5602a26004436) {
      std::istream::read((char *)local_258,(long)&magicByte + 6);
      if (magicByte._6_2_ == 1) {
        local_50 = 0;
        std::istream::read((char *)local_258,(long)&local_50);
        uVar1 = local_50;
        uVar3 = TLangModel::GetCheckSum(&this->LangModel);
        if (uVar1 == uVar3) {
          this_00 = (TBloomFilter *)operator_new(8);
          TBloomFilter::TBloomFilter(this_00);
          checkSum = (uint64_t)this_00;
          this_01 = (TBloomFilter *)operator_new(8);
          TBloomFilter::TBloomFilter(this_01);
          local_40 = this_01;
          TBloomFilter::Load(this_00,local_258);
          TBloomFilter::Load(this_01,local_258);
          local_38 = 0;
          std::istream::read((char *)local_258,(long)&local_38);
          bVar4 = local_38 == 0x34e5602a26004436;
          if (bVar4) {
            std::
            __uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
            ::reset((__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                     *)&this->Deletes1,this_00);
            std::
            __uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
            ::reset((__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                     *)&this->Deletes2,this_01);
          }
          else {
            TBloomFilter::~TBloomFilter(this_01);
            operator_delete(this_01);
            TBloomFilter::~TBloomFilter(this_00);
            operator_delete(this_00);
          }
          goto LAB_001086d3;
        }
      }
    }
  }
  bVar4 = false;
LAB_001086d3:
  std::ifstream::~ifstream(local_258);
  return bVar4;
}

Assistant:

bool TSpellCorrector::LoadCache(const std::string& cacheFile) {
    std::ifstream in(cacheFile, std::ios::binary);
    if (!in.is_open()) {
        return false;
    }
    uint16_t version = 0;
    uint64_t magicByte = 0;
    NHandyPack::Load(in, magicByte);
    if (magicByte != SPELL_CHECKER_CACHE_MAGIC_BYTE) {
        return false;
    }
    NHandyPack::Load(in, version);
    if (version != SPELL_CHECKER_CACHE_VERSION) {
        return false;
    }
    uint64_t checkSum = 0;
    NHandyPack::Load(in, checkSum);
    if (checkSum != LangModel.GetCheckSum()) {
        return false;
    }
    std::unique_ptr<TBloomFilter> deletes1(new TBloomFilter());
    std::unique_ptr<TBloomFilter> deletes2(new TBloomFilter());
    deletes1->Load(in);
    deletes2->Load(in);
    magicByte = 0;
    NHandyPack::Load(in, magicByte);
    if (magicByte != SPELL_CHECKER_CACHE_MAGIC_BYTE) {
        return false;
    }
    Deletes1 = std::move(deletes1);
    Deletes2 = std::move(deletes2);
    return true;
}